

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::throwMessage(Forth *this,string *msg,errorCodes ec)

{
  Cell src;
  Cell CVar1;
  string buffer;
  string local_40;
  
  initClass(this);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  src = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
  CVar1 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  moveFromDataSpace(this,&local_40,src,(ulong)CVar1);
  ForthStack<unsigned_int>::push(&this->dStack,ec);
  exceptionsThrow(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void throwMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			dStack.push(ec);
			exceptionsThrow();
			//throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}